

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdCofactoring(uint *pTruth,int nVars,int *pCofVars,int nLimit,int fVerbose)

{
  ulong uVar1;
  Kit_DsdObj_t KVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *__ptr;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  Kit_DsdNtk_t *pKVar12;
  Kit_DsdNtk_t *pKVar13;
  ulong uVar14;
  Kit_DsdNtk_t *pNtk;
  byte bVar15;
  ulong uVar16;
  uint **ppuVar17;
  uint uVar18;
  int iVar19;
  undefined1 *puVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  Kit_DsdNtk_t **ppKVar25;
  int pTryVars [16];
  Kit_DsdNtk_t *ppNtks [5] [16];
  int local_61c;
  int local_608;
  uint local_604;
  uint **local_5e8;
  ulong local_5d8;
  int local_578 [16];
  Kit_DsdNtk_t *local_538 [17];
  undefined1 local_4b0 [504];
  uint *local_2b8 [81];
  
  memset(local_538,0,0x280);
  if (4 < nLimit) {
    __assert_fail("nLimit < 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xa86,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  bVar15 = (byte)(nVars + -5);
  iVar6 = 0x50 << (bVar15 & 0x1f);
  if (nVars < 6) {
    iVar6 = 0x50;
  }
  iVar19 = nVars + -5;
  if (nVars < 6) {
    iVar19 = 0;
  }
  local_2b8[0] = (uint *)malloc((long)iVar6 << 2);
  ppuVar17 = local_2b8;
  lVar21 = 0;
  iVar6 = 0;
  do {
    iVar9 = iVar6;
    lVar24 = 0;
    do {
      ppuVar17[lVar24] = local_2b8[0] + (iVar9 + (int)lVar24 << ((byte)iVar19 & 0x1f));
      __ptr = local_2b8[0];
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x10);
    lVar21 = lVar21 + 1;
    ppuVar17 = ppuVar17 + 0x10;
    iVar6 = iVar9 + 0x10;
  } while (lVar21 != 5);
  uVar7 = 1 << (bVar15 & 0x1f);
  if (nVars < 6) {
    uVar7 = 1;
  }
  if (iVar9 != 0x40) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xa8f,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  if (0 < (int)uVar7) {
    uVar11 = (ulong)uVar7 + 1;
    do {
      local_2b8[0][uVar11 - 2] = pTruth[uVar11 - 2];
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  iVar6 = 0;
  local_538[0] = Kit_DsdDecomposeInt(local_2b8[0],nVars,0);
  if (fVerbose != 0) {
    printf("\nProcessing prime function with %d support variables:\n",(ulong)(uint)nVars);
  }
  if (0 < nLimit) {
    local_5e8 = local_2b8;
    puVar20 = local_4b0;
    uVar11 = 0;
    do {
      uVar18 = 1 << ((byte)uVar11 & 0x1f);
      uVar7 = Kit_DsdCofactoringGetVars(local_538 + uVar11 * 0x10,uVar18,local_578);
      if (uVar7 == 0) goto LAB_0055de55;
      if ((int)uVar7 < 1) {
LAB_0055deb1:
        __assert_fail("iVarBest != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0xac3,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
      }
      uVar1 = uVar11 + 1;
      local_5d8 = (ulong)uVar18;
      local_61c = -1;
      local_604 = 10000;
      uVar14 = 0;
      local_608 = 10000;
      do {
        iVar6 = local_578[uVar14];
        uVar16 = 0;
        iVar19 = 0;
        uVar18 = 0;
        do {
          puVar3 = local_2b8[uVar1 * 0x10 + uVar16 * 2];
          puVar4 = local_2b8[uVar11 * 0x10 + uVar16];
          Kit_TruthCofactor0New(puVar3,puVar4,nVars,iVar6);
          puVar5 = local_2b8[uVar1 * 0x10 + uVar16 * 2 + 1];
          Kit_TruthCofactor1New(puVar5,puVar4,nVars,iVar6);
          pKVar12 = Kit_DsdDecomposeInt(puVar3,nVars,0);
          local_538[uVar1 * 0x10 + uVar16 * 2] = pKVar12;
          pKVar13 = Kit_DsdDecomposeInt(puVar5,nVars,0);
          local_538[uVar1 * 0x10 + uVar16 * 2 + 1] = pKVar13;
          uVar8 = 0;
          if ((ulong)pKVar12->nNodes != 0) {
            uVar22 = 0;
            uVar8 = 0;
            do {
              if (pKVar12->pNodes[uVar22] == (Kit_DsdObj_t *)0x0) break;
              KVar2 = *pKVar12->pNodes[uVar22];
              uVar23 = (uint)KVar2 >> 0x1a;
              if (uVar23 < uVar8) {
                uVar23 = uVar8;
              }
              if (((uint)KVar2 & 0x1c0) == 0x140) {
                uVar8 = uVar23;
              }
              uVar22 = uVar22 + 1;
            } while (pKVar12->nNodes != uVar22);
          }
          if (uVar8 < uVar18) {
            uVar8 = uVar18;
          }
          if ((ulong)pKVar13->nNodes == 0) {
            uVar18 = 0;
          }
          else {
            uVar22 = 0;
            uVar18 = 0;
            do {
              if (pKVar13->pNodes[uVar22] == (Kit_DsdObj_t *)0x0) break;
              KVar2 = *pKVar13->pNodes[uVar22];
              uVar23 = (uint)KVar2 >> 0x1a;
              if (uVar23 < uVar18) {
                uVar23 = uVar18;
              }
              if (((uint)KVar2 & 0x1c0) == 0x140) {
                uVar18 = uVar23;
              }
              uVar22 = uVar22 + 1;
            } while (pKVar13->nNodes != uVar22);
          }
          if (uVar18 < uVar8) {
            uVar18 = uVar8;
          }
          iVar9 = Kit_TruthSupportSize(puVar3,nVars);
          iVar10 = Kit_TruthSupportSize(puVar5,nVars);
          iVar19 = iVar10 + iVar19 + iVar9;
          Kit_DsdNtkFree(pKVar12);
          Kit_DsdNtkFree(pKVar13);
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_5d8);
        if ((uVar18 < local_604) || ((local_604 == uVar18 && (iVar19 < local_608)))) {
          local_61c = iVar6;
          local_608 = iVar19;
          local_604 = uVar18;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar7);
      if (local_61c == -1) goto LAB_0055deb1;
      if (pCofVars != (int *)0x0) {
        pCofVars[uVar11] = local_61c;
      }
      uVar11 = 0;
      do {
        puVar3 = local_5e8[uVar11 + 0x10];
        puVar4 = *(uint **)((long)local_5e8 + uVar11 * 4);
        Kit_TruthCofactor0New(puVar3,puVar4,nVars,local_61c);
        puVar5 = local_5e8[uVar11 + 0x11];
        Kit_TruthCofactor1New(puVar5,puVar4,nVars,local_61c);
        pKVar12 = Kit_DsdDecomposeInt(puVar3,nVars,0);
        *(Kit_DsdNtk_t **)(puVar20 + uVar11 * 8 + -8) = pKVar12;
        pKVar13 = Kit_DsdDecomposeInt(puVar5,nVars,0);
        *(Kit_DsdNtk_t **)(puVar20 + uVar11 * 8) = pKVar13;
        if (fVerbose != 0) {
          pNtk = Kit_DsdExpand(pKVar12);
          *(Kit_DsdNtk_t **)(puVar20 + uVar11 * 8 + -8) = pNtk;
          Kit_DsdNtkFree(pKVar12);
          pKVar12 = Kit_DsdExpand(pKVar13);
          *(Kit_DsdNtk_t **)(puVar20 + uVar11 * 8) = pKVar12;
          Kit_DsdNtkFree(pKVar13);
          printf("Cof%d%d: ",uVar1 & 0xffffffff,uVar11 & 0xffffffff);
          Kit_DsdPrint(_stdout,pNtk);
          putchar(10);
          printf("Cof%d%d: ",uVar1 & 0xffffffff,(ulong)((int)uVar11 + 1));
          Kit_DsdPrint(_stdout,pKVar12);
          putchar(10);
        }
        uVar11 = uVar11 + 2;
        local_5d8 = local_5d8 - 1;
      } while (local_5d8 != 0);
      local_5e8 = local_5e8 + 0x10;
      puVar20 = puVar20 + 0x80;
      uVar11 = uVar1;
    } while (uVar1 != (uint)nLimit);
    uVar11 = (ulong)(uint)nLimit;
LAB_0055de55:
    iVar6 = (int)uVar11;
  }
  ppKVar25 = local_538;
  lVar21 = 0;
  do {
    lVar24 = 0;
    do {
      if (ppKVar25[lVar24] != (Kit_DsdNtk_t *)0x0) {
        Kit_DsdNtkFree(ppKVar25[lVar24]);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x10);
    lVar21 = lVar21 + 1;
    ppKVar25 = ppKVar25 + 0x10;
  } while (lVar21 != 5);
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  if (nLimit < iVar6) {
    __assert_fail("nStep <= nLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xae4,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  return iVar6;
}

Assistant:

int Kit_DsdCofactoring( unsigned * pTruth, int nVars, int * pCofVars, int nLimit, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[5][16] = {
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0}
    };
    Kit_DsdNtk_t * pTemp;
    unsigned * ppCofs[5][16];
    int pTryVars[16], nTryVars;
    int nPrimeSizeMin, nPrimeSizeMax, nPrimeSizeCur;
    int nSuppSizeMin, nSuppSizeMax, iVarBest;
    int i, k, v, nStep, nSize, nMemSize;
    assert( nLimit < 5 );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );
    ppNtks[0][0] = Kit_DsdDecompose( ppCofs[0][0], nVars );

    if ( fVerbose )
        printf( "\nProcessing prime function with %d support variables:\n", nVars );

    // perform recursive cofactoring
    for ( nStep = 0; nStep < nLimit; nStep++ )
    {
        nSize = (1 << nStep);
        // find the variables to use in the cofactoring step
        nTryVars = Kit_DsdCofactoringGetVars( ppNtks[nStep], nSize, pTryVars );
        if ( nTryVars == 0 )
            break;
        // cofactor w.r.t. the above variables
        iVarBest = -1;
        nPrimeSizeMin = 10000;
        nSuppSizeMin  = 10000;
        for ( v = 0; v < nTryVars; v++ )
        {
            nPrimeSizeMax = 0;
            nSuppSizeMax = 0;
            for ( i = 0; i < nSize; i++ )
            {
                // cofactor and decompose cofactors          
                Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, pTryVars[v] );
                Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, pTryVars[v] );
                ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
                ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
                // compute the largest non-decomp block
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+0]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+1]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                // compute the sum total of supports
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+0], nVars );
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+1], nVars );
                // free the networks
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+1] );
            }
            // find the min max support size of the prime component
            if ( nPrimeSizeMin > nPrimeSizeMax || (nPrimeSizeMin == nPrimeSizeMax && nSuppSizeMin > nSuppSizeMax) )
            {
                nPrimeSizeMin = nPrimeSizeMax;
                nSuppSizeMin  = nSuppSizeMax;
                iVarBest      = pTryVars[v];
            }
        }
        assert( iVarBest != -1 );
        // save the variable
        if ( pCofVars )
            pCofVars[nStep] = iVarBest;
        // cofactor w.r.t. the best
        for ( i = 0; i < nSize; i++ )
        {
            Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, iVarBest );
            Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, iVarBest );
            ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
            ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
            if ( fVerbose )
            {
                ppNtks[nStep+1][2*i+0] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( pTemp );
                ppNtks[nStep+1][2*i+1] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+1] );
                Kit_DsdNtkFree( pTemp );

                printf( "Cof%d%d: ", nStep+1, 2*i+0 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+0] ), printf( "\n" );
                printf( "Cof%d%d: ", nStep+1, 2*i+1 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+1] ), printf( "\n" );
            }
        }
    }

    // free the networks
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        if ( ppNtks[i][k] )
            Kit_DsdNtkFree( ppNtks[i][k] );
    ABC_FREE( ppCofs[0][0] );

    assert( nStep <= nLimit );
    return nStep;
}